

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  GCObject *pGVar3;
  GCObject **ppGVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  
  pgVar1 = L->l_G;
  luaC_runtilstate(L,-5);
  iVar6 = (pgVar1->strt).size;
  if (iVar6 < newsize) {
    if (newsize < -1) goto LAB_0010fc3b;
    ppGVar4 = (GCObject **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar6 << 3,(long)newsize * 8);
    (pgVar1->strt).hash = ppGVar4;
    iVar6 = (pgVar1->strt).size;
    lVar5 = (long)iVar6;
    if (iVar6 < newsize) {
      do {
        (pgVar1->strt).hash[lVar5] = (GCObject *)0x0;
        lVar5 = lVar5 + 1;
      } while (newsize != lVar5);
    }
  }
  iVar6 = (pgVar1->strt).size;
  if (0 < iVar6) {
    lVar5 = 0;
    do {
      ppGVar4 = (pgVar1->strt).hash;
      pGVar2 = ppGVar4[lVar5];
      ppGVar4[lVar5] = (GCObject *)0x0;
      while (pGVar2 != (GCObject *)0x0) {
        pGVar3 = (pGVar2->gch).next;
        uVar7 = (pGVar2->h).sizearray & newsize - 1U;
        (pGVar2->gch).next = (pgVar1->strt).hash[uVar7];
        (pgVar1->strt).hash[uVar7] = pGVar2;
        (pGVar2->gch).marked = (pGVar2->gch).marked & 0xbf;
        pGVar2 = pGVar3;
      }
      lVar5 = lVar5 + 1;
      iVar6 = (pgVar1->strt).size;
    } while (lVar5 < iVar6);
  }
  if (newsize < iVar6) {
    if (newsize < -1) {
LAB_0010fc3b:
      luaM_toobig(L);
    }
    ppGVar4 = (GCObject **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar6 << 3,(long)newsize << 3);
    (pgVar1->strt).hash = ppGVar4;
  }
  (pgVar1->strt).size = newsize;
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  int i;
  stringtable *tb = &G(L)->strt;
  /* cannot resize while GC is traversing strings */
  luaC_runtilstate(L, ~bitmask(GCSsweepstring));
  if (newsize > tb->size) {
    luaM_reallocvector(L, tb->hash, tb->size, newsize, GCObject *);
    for (i = tb->size; i < newsize; i++) tb->hash[i] = NULL;
  }
  /* rehash */
  for (i=0; i<tb->size; i++) {
    GCObject *p = tb->hash[i];
    tb->hash[i] = NULL;
    while (p) {  /* for each node in the list */
      GCObject *next = gch(p)->next;  /* save next */
      unsigned int h = lmod(gco2ts(p)->hash, newsize);  /* new position */
      gch(p)->next = tb->hash[h];  /* chain it */
      tb->hash[h] = p;
      resetoldbit(p);  /* see MOVE OLD rule */
      p = next;
    }
  }
  if (newsize < tb->size) {
    /* shrinking slice must be empty */
    lua_assert(tb->hash[newsize] == NULL && tb->hash[tb->size - 1] == NULL);
    luaM_reallocvector(L, tb->hash, tb->size, newsize, GCObject *);
  }
  tb->size = newsize;
}